

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

void handle_alpha_block(void *pBlock,color_quad_u8 *pPixels,
                       bc7enc_compress_block_params *pComp_params,
                       color_cell_compressor_params *pParams)

{
  uint uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  uint32_t i_1;
  uint32_t subset_1;
  uint64_t err;
  color_cell_compressor_results *pResults;
  uint32_t subset;
  uint64_t trial_err;
  uint32_t p;
  uint32_t idx;
  color_cell_compressor_results subset_results7 [2];
  uint8_t subset_selectors7 [2] [16];
  uint8_t subset_pixel_index7 [2] [16];
  uint32_t subset_total_colors7 [2];
  color_quad_u8 subset_colors [2] [16];
  uint8_t *pPartition;
  uint32_t trial_partition;
  uint64_t mode5_alpha_err;
  uint64_t mode5_err;
  uint32_t a;
  uint32_t i;
  uint32_t hi_a;
  uint32_t lo_a;
  uint32_t best_mode;
  uint64_t best_err;
  uint8_t selectors_temp [16];
  color_cell_compressor_results results6;
  bc7_optimization_results opt_results7;
  bc7_optimization_results opt_results5;
  bc7_optimization_results opt_results6;
  uint local_308;
  uint local_304;
  uint local_2ec;
  ulong local_2e8;
  uint local_2dc;
  undefined4 auStack_2d0 [4];
  long alStack_2c0 [7];
  undefined1 local_288 [24];
  bc7_optimization_results *in_stack_fffffffffffffd90;
  uint32_t in_stack_fffffffffffffd98;
  uint32_t in_stack_fffffffffffffd9c;
  color_cell_compressor_params *in_stack_fffffffffffffda0;
  bc7enc_compress_block_params *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  uint32_t in_stack_fffffffffffffdb4;
  uint32_t *in_stack_fffffffffffffdb8;
  bc7enc_compress_block_params *in_stack_fffffffffffffdc0;
  color_quad_u8 *in_stack_fffffffffffffdc8;
  bc7_optimization_results *in_stack_fffffffffffffe08;
  void *in_stack_fffffffffffffe10;
  ulong local_1a0;
  uint local_190;
  uint32_t local_18c;
  uint32_t local_188;
  int local_184;
  ulong local_180;
  undefined1 local_178 [24];
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined4 local_140;
  uint32_t local_13c;
  undefined1 auStack_138 [32];
  undefined4 auStack_118 [12];
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined1 auStack_78 [32];
  undefined4 local_58;
  undefined4 local_4c;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 *local_20;
  long local_18;
  long local_10;
  
  *(uint32_t **)(in_RCX + 6) = g_bc7_weights4;
  *(float **)(in_RCX + 8) = g_bc7_weights4x;
  in_RCX[4] = 0x10;
  in_RCX[10] = 7;
  *(undefined1 *)((long)in_RCX + 0x3d) = 1;
  *(undefined1 *)((long)in_RCX + 0x3e) = 0;
  *(undefined1 *)(in_RCX + 0xf) = 1;
  *(undefined1 *)((long)in_RCX + 0x3f) = *(undefined1 *)(in_RDX + 0x18);
  *in_RCX = 0x10;
  *(long *)(in_RCX + 2) = in_RSI;
  local_150 = auStack_78;
  local_148 = local_178;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_180 = color_cell_compression
                        ((uint32_t)subset_colors[1][0xf].m_c,
                         (color_cell_compressor_params *)subset_colors[1]._48_8_,
                         (color_cell_compressor_results *)subset_colors[1]._40_8_,
                         (bc7enc_compress_block_params *)subset_colors[1]._32_8_);
  local_184 = 6;
  if ((local_180 != 0) && (*(char *)(local_18 + 0x1b) != '\0')) {
    local_188 = 0xff;
    local_18c = 0;
    for (local_190 = 0; local_190 < 0x10; local_190 = local_190 + 1) {
      uVar1 = (uint)*(byte *)(local_10 + 3 + (ulong)local_190 * 4);
      local_188 = minimumu(local_188,uVar1);
      local_18c = maximumu(local_18c,uVar1);
    }
    handle_alpha_block_mode5
              ((color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
               (uint64_t *)in_stack_fffffffffffffdc0,(uint64_t *)in_stack_fffffffffffffdc8);
    if (local_1a0 < local_180) {
      local_180 = local_1a0;
      local_184 = 5;
    }
  }
  if ((local_180 != 0) && (*(char *)(local_18 + 0x1c) != '\0')) {
    uVar2 = estimate_partition(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                               in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4);
    *(uint32_t **)(local_20 + 6) = g_bc7_weights2;
    *(float **)(local_20 + 8) = g_bc7_weights2x;
    local_20[4] = 4;
    local_20[10] = 5;
    *(undefined1 *)((long)local_20 + 0x3d) = 1;
    *(undefined1 *)((long)local_20 + 0x3e) = 0;
    *(undefined1 *)(local_20 + 0xf) = 1;
    memset(&stack0xfffffffffffffdc0,0,8);
    for (local_2dc = 0; local_2dc < 0x10; local_2dc = local_2dc + 1) {
      uVar1 = (uint)""[(ulong)local_2dc + (ulong)(uVar2 << 4)];
      *(undefined4 *)
       (&stack0xfffffffffffffdc8 +
       (ulong)*(uint *)(&stack0xfffffffffffffdc0 + (ulong)uVar1 * 4) * 4 + (ulong)uVar1 * 0x40) =
           *(undefined4 *)(local_10 + (ulong)local_2dc * 4);
      (&stack0xfffffffffffffd98)
      [(ulong)*(uint *)(&stack0xfffffffffffffdc0 + (ulong)uVar1 * 4) + (ulong)uVar1 * 0x10] =
           (char)local_2dc;
      *(int *)(&stack0xfffffffffffffdc0 + (ulong)uVar1 * 4) =
           *(int *)(&stack0xfffffffffffffdc0 + (ulong)uVar1 * 4) + 1;
    }
    local_2e8 = 0;
    for (local_2ec = 0; local_2ec < 2; local_2ec = local_2ec + 1) {
      *local_20 = *(undefined4 *)(&stack0xfffffffffffffdc0 + (ulong)local_2ec * 4);
      *(undefined1 **)(local_20 + 2) = &stack0xfffffffffffffdc8 + (ulong)local_2ec * 0x40;
      alStack_2c0[(ulong)local_2ec * 5] = (long)(local_288 + (ulong)local_2ec * 0x10);
      alStack_2c0[(ulong)local_2ec * 5 + 1] = (long)local_178;
      uVar3 = color_cell_compression
                        ((uint32_t)subset_colors[1][0xf].m_c,
                         (color_cell_compressor_params *)subset_colors[1]._48_8_,
                         (color_cell_compressor_results *)subset_colors[1]._40_8_,
                         (bc7enc_compress_block_params *)subset_colors[1]._32_8_);
      local_2e8 = uVar3 + local_2e8;
      if (local_180 < local_2e8) break;
    }
    if (local_2e8 < local_180) {
      local_184 = 7;
      local_140 = 7;
      local_13c = uVar2;
      local_e4 = 0;
      local_e8 = 0;
      for (local_304 = 0; local_304 < 2; local_304 = local_304 + 1) {
        for (local_308 = 0; local_308 < *(uint *)(&stack0xfffffffffffffdc0 + (ulong)local_304 * 4);
            local_308 = local_308 + 1) {
          auStack_138[(byte)(&stack0xfffffffffffffd98)[(ulong)local_308 + (ulong)local_304 * 0x10]]
               = local_288[(ulong)local_308 + (ulong)local_304 * 0x10];
        }
        auStack_118[local_304] = auStack_2d0[(ulong)local_304 * 10];
        auStack_118[(ulong)local_304 + 3] = auStack_2d0[(ulong)local_304 * 10 + 1];
        auStack_118[(ulong)local_304 * 2 + 6] = auStack_2d0[(ulong)local_304 * 10 + 2];
        auStack_118[(ulong)local_304 * 2 + 7] =
             *(undefined4 *)((long)alStack_2c0 + (ulong)local_304 * 0x28 + -4);
      }
    }
  }
  if (local_184 == 7) {
    encode_bc7_block(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  else if (local_184 == 5) {
    local_e0 = 5;
    local_dc = 0;
    local_88 = 0;
    local_84 = 0;
    encode_bc7_block(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  else if (local_184 == 6) {
    local_80 = 6;
    local_7c = 0;
    local_58 = local_160;
    local_4c = local_15c;
    local_40 = local_158;
    local_3c = local_154;
    local_28 = 0;
    local_24 = 0;
    encode_bc7_block(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  return;
}

Assistant:

static void handle_alpha_block(void *pBlock, const color_quad_u8 *pPixels, const bc7enc_compress_block_params *pComp_params, color_cell_compressor_params *pParams)
{
	pParams->m_pSelector_weights = g_bc7_weights4;
	pParams->m_pSelector_weightsx = (const vec4F *)g_bc7_weights4x;
	pParams->m_num_selector_weights = 16;
	pParams->m_comp_bits = 7;
	pParams->m_has_pbits = BC7ENC_TRUE;
	pParams->m_endpoints_share_pbit = BC7ENC_FALSE;
	pParams->m_has_alpha = BC7ENC_TRUE;
	pParams->m_perceptual = pComp_params->m_perceptual;
	pParams->m_num_pixels = 16;
	pParams->m_pPixels = pPixels;
		
	bc7_optimization_results opt_results6, opt_results5, opt_results7;
	
	color_cell_compressor_results results6;
	results6.m_pSelectors = opt_results6.m_selectors;
	uint8_t selectors_temp[16];
	results6.m_pSelectors_temp = selectors_temp;

	uint64_t best_err = color_cell_compression(6, pParams, &results6, pComp_params);
	uint32_t best_mode = 6;

	if ((best_err > 0) && (pComp_params->m_use_mode5_for_alpha))
	{
		uint32_t lo_a = 255, hi_a = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			uint32_t a = pPixels[i].m_c[3];
			lo_a = minimumu(lo_a, a);
			hi_a = maximumu(hi_a, a);
		}

		uint64_t mode5_err, mode5_alpha_err;
		handle_alpha_block_mode5(pPixels, pComp_params, pParams, lo_a, hi_a, &opt_results5, &mode5_err, &mode5_alpha_err);

		if (mode5_err < best_err)
		{
			best_err = mode5_err;
			best_mode = 5;
		}
	}

	if ((best_err > 0) && (pComp_params->m_use_mode7_for_alpha))
	{
		const uint32_t trial_partition = estimate_partition(pPixels, pComp_params, pParams->m_weights, 7);

		pParams->m_pSelector_weights = g_bc7_weights2;
		pParams->m_pSelector_weightsx = (const vec4F*)g_bc7_weights2x;
		pParams->m_num_selector_weights = 4;
		pParams->m_comp_bits = 5;
		pParams->m_has_pbits = BC7ENC_TRUE;
		pParams->m_endpoints_share_pbit = BC7ENC_FALSE;
		pParams->m_has_alpha = BC7ENC_TRUE;

		const uint8_t* pPartition = &g_bc7_partition2[trial_partition * 16];

		color_quad_u8 subset_colors[2][16];

		uint32_t subset_total_colors7[2] = { 0, 0 };

		uint8_t subset_pixel_index7[2][16];
		uint8_t subset_selectors7[2][16];
		color_cell_compressor_results subset_results7[2];

		for (uint32_t idx = 0; idx < 16; idx++)
		{
			const uint32_t p = pPartition[idx];
			subset_colors[p][subset_total_colors7[p]] = pPixels[idx];
			subset_pixel_index7[p][subset_total_colors7[p]] = (uint8_t)idx;
			subset_total_colors7[p]++;
		}

		uint64_t trial_err = 0;
		for (uint32_t subset = 0; subset < 2; subset++)
		{
			pParams->m_num_pixels = subset_total_colors7[subset];
			pParams->m_pPixels = &subset_colors[subset][0];

			color_cell_compressor_results* pResults = &subset_results7[subset];
			pResults->m_pSelectors = &subset_selectors7[subset][0];
			pResults->m_pSelectors_temp = selectors_temp;
			uint64_t err = color_cell_compression(7, pParams, pResults, pComp_params);
			trial_err += err;
			if (trial_err > best_err)
				break;

		} // subset

		if (trial_err < best_err)
		{
			best_err = trial_err;
			best_mode = 7;
			opt_results7.m_mode = 7;
			opt_results7.m_partition = trial_partition;
			opt_results7.m_index_selector = 0;
			opt_results7.m_rotation = 0;
			for (uint32_t subset = 0; subset < 2; subset++)
			{
				for (uint32_t i = 0; i < subset_total_colors7[subset]; i++)
					opt_results7.m_selectors[subset_pixel_index7[subset][i]] = subset_selectors7[subset][i];
				opt_results7.m_low[subset] = subset_results7[subset].m_low_endpoint;
				opt_results7.m_high[subset] = subset_results7[subset].m_high_endpoint;
				opt_results7.m_pbits[subset][0] = subset_results7[subset].m_pbits[0];
				opt_results7.m_pbits[subset][1] = subset_results7[subset].m_pbits[1];
			}
		}
	}

	if (best_mode == 7)
	{
		encode_bc7_block(pBlock, &opt_results7);
	}
	else if (best_mode == 5)
	{
		opt_results5.m_mode = 5;
		opt_results5.m_partition = 0;
		opt_results5.m_rotation = 0;
		opt_results5.m_index_selector = 0;

		encode_bc7_block(pBlock, &opt_results5);
	}
	else if (best_mode == 6)
	{
		opt_results6.m_mode = 6;
		opt_results6.m_partition = 0;
		opt_results6.m_low[0] = results6.m_low_endpoint;
		opt_results6.m_high[0] = results6.m_high_endpoint;
		opt_results6.m_pbits[0][0] = results6.m_pbits[0];
		opt_results6.m_pbits[0][1] = results6.m_pbits[1];
		opt_results6.m_rotation = 0;
		opt_results6.m_index_selector = 0;

		encode_bc7_block(pBlock, &opt_results6);
	}
}